

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_err_t linear_hash_get_record
                    (ion_fpos_t loc,ion_byte_t *key,ion_byte_t *value,ion_byte_t *status,
                    linear_hash_table_t *linear_hash)

{
  int iVar1;
  FILE *__stream;
  size_t __n;
  long lVar2;
  ion_err_t iVar3;
  int iVar4;
  size_t sVar5;
  ion_byte_t *piVar6;
  ion_byte_t *piVar7;
  ion_byte_t *piVar8;
  ion_byte_t *piVar9;
  ion_byte_t *__ptr;
  size_t sStack_40;
  ion_byte_t aiStack_38 [8];
  
  sStack_40 = 0x10be4f;
  iVar4 = fseek((FILE *)linear_hash->database,loc,0);
  iVar3 = '\r';
  if (iVar4 == 0) {
    sVar5 = linear_hash->record_total_size;
    lVar2 = -(sVar5 + 0xf & 0xfffffffffffffff0);
    __ptr = aiStack_38 + lVar2;
    __stream = (FILE *)linear_hash->database;
    piVar6 = aiStack_38 + lVar2 + -8;
    piVar6[0] = '\x01';
    piVar6[1] = '\0';
    piVar6[2] = '\0';
    piVar6[3] = '\0';
    piVar6[4] = '\0';
    piVar6[5] = '\0';
    piVar6[6] = '\0';
    piVar6[7] = '\0';
    __n = *(size_t *)(aiStack_38 + lVar2 + -8);
    piVar7 = aiStack_38 + lVar2 + -8;
    piVar7[0] = '{';
    piVar7[1] = 0xbe;
    piVar7[2] = '\x10';
    piVar7[3] = '\0';
    piVar7[4] = '\0';
    piVar7[5] = '\0';
    piVar7[6] = '\0';
    piVar7[7] = '\0';
    sVar5 = fread(__ptr,sVar5,__n,__stream);
    iVar3 = '\b';
    if (sVar5 == 1) {
      *status = *__ptr;
      iVar4 = (linear_hash->super).record.key_size;
      piVar8 = aiStack_38 + lVar2 + -8;
      piVar8[0] = 0x9e;
      piVar8[1] = 0xbe;
      piVar8[2] = '\x10';
      piVar8[3] = '\0';
      piVar8[4] = '\0';
      piVar8[5] = '\0';
      piVar8[6] = '\0';
      piVar8[7] = '\0';
      memcpy(key,aiStack_38 + lVar2 + 1,(long)iVar4);
      iVar4 = (linear_hash->super).record.key_size;
      iVar1 = (linear_hash->super).record.value_size;
      piVar9 = aiStack_38 + lVar2 + -8;
      piVar9[0] = 0xb5;
      piVar9[1] = 0xbe;
      piVar9[2] = '\x10';
      piVar9[3] = '\0';
      piVar9[4] = '\0';
      piVar9[5] = '\0';
      piVar9[6] = '\0';
      piVar9[7] = '\0';
      memcpy(value,__ptr + (long)iVar4 + 1,(long)iVar1);
      iVar3 = '\0';
    }
  }
  return iVar3;
}

Assistant:

ion_err_t
linear_hash_get_record(
	ion_fpos_t			loc,
	ion_byte_t			*key,
	ion_byte_t			*value,
	ion_byte_t			*status,
	linear_hash_table_t *linear_hash
) {
	/* seek to location of record in file */
	if (0 != fseek(linear_hash->database, loc, SEEK_SET)) {
		return err_file_bad_seek;
	}

	/* cache record data from file */
	ion_byte_t *record = alloca(linear_hash->record_total_size);

	if (1 != fread(record, linear_hash->record_total_size, 1, linear_hash->database)) {
		return err_file_read_error;
	}

	/* read record data elements */
	memcpy(status, record, sizeof(*status));
	memcpy(key, record + sizeof(*status), linear_hash->super.record.key_size);
	memcpy(value, record + sizeof(*status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

	return err_ok;
}